

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  CppType CVar4;
  Label LVar5;
  Type TVar6;
  Syntax SVar7;
  OneofDescriptor *pOVar8;
  FileDescriptor *this_00;
  FieldDescriptor *in_RCX;
  GeneratorOptions *in_RDX;
  GeneratorOptions *in_RSI;
  bool use_default;
  string typed_annotation;
  BytesMode bytes_mode;
  bool untyped;
  string value_type;
  string key_type;
  FieldDescriptor *value_field;
  FieldDescriptor *key_field;
  undefined8 in_stack_fffffffffffff4d8;
  char *pcVar9;
  undefined4 uVar10;
  FieldDescriptor *in_stack_fffffffffffff4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  uint uVar13;
  Printer *pPVar12;
  GeneratorOptions *in_stack_fffffffffffff4e8;
  char *pcVar14;
  FieldDescriptor *in_stack_fffffffffffff4f0;
  FieldDescriptor *in_stack_fffffffffffff4f8;
  Descriptor *in_stack_fffffffffffff520;
  GeneratorOptions *in_stack_fffffffffffff528;
  Printer *in_stack_fffffffffffff530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff538;
  GeneratorOptions *in_stack_fffffffffffff540;
  allocator *in_stack_fffffffffffff548;
  Printer *in_stack_fffffffffffff550;
  GeneratorOptions *in_stack_fffffffffffff558;
  undefined8 in_stack_fffffffffffff560;
  GeneratorOptions *in_stack_fffffffffffff568;
  undefined7 in_stack_fffffffffffff570;
  undefined1 in_stack_fffffffffffff577;
  Printer *in_stack_fffffffffffff578;
  GeneratorOptions *in_stack_fffffffffffff580;
  char *in_stack_fffffffffffff588;
  char **in_stack_fffffffffffff590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5a0;
  undefined7 in_stack_fffffffffffff5a8;
  undefined1 in_stack_fffffffffffff5af;
  undefined8 in_stack_fffffffffffff5b0;
  undefined8 in_stack_fffffffffffff5b8;
  Printer *in_stack_fffffffffffff5c0;
  undefined7 in_stack_fffffffffffff5c8;
  undefined1 in_stack_fffffffffffff5cf;
  allocator *in_stack_fffffffffffff5d0;
  undefined8 in_stack_fffffffffffff5d8;
  OneofDescriptor *in_stack_fffffffffffff5e0;
  GeneratorOptions *in_stack_fffffffffffff5e8;
  undefined8 in_stack_fffffffffffff5f0;
  undefined8 in_stack_fffffffffffff5f8;
  Descriptor *in_stack_fffffffffffff600;
  undefined8 in_stack_fffffffffffff608;
  undefined8 in_stack_fffffffffffff610;
  Descriptor *in_stack_fffffffffffff618;
  undefined1 in_stack_fffffffffffff620;
  undefined1 in_stack_fffffffffffff621;
  undefined1 in_stack_fffffffffffff622;
  undefined4 in_stack_fffffffffffff623;
  undefined1 in_stack_fffffffffffff627;
  undefined1 uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff628;
  Printer *in_stack_fffffffffffff630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff638;
  undefined8 uVar16;
  char (*in_stack_fffffffffffff640) [9];
  undefined8 uVar17;
  char **in_stack_fffffffffffff648;
  BytesMode bytes_mode_00;
  undefined1 in_stack_fffffffffffff654;
  undefined1 in_stack_fffffffffffff656;
  FieldDescriptor *in_stack_fffffffffffff658;
  Printer *in_stack_fffffffffffff660;
  GeneratorOptions *in_stack_fffffffffffff668;
  Generator *in_stack_fffffffffffff670;
  byte local_981;
  FieldDescriptor *in_stack_fffffffffffff6c0;
  undefined4 in_stack_fffffffffffff6c8;
  undefined4 in_stack_fffffffffffff6cc;
  undefined8 in_stack_fffffffffffff6e0;
  FieldDescriptor *in_stack_fffffffffffff6e8;
  char *in_stack_fffffffffffff6f0;
  Printer *in_stack_fffffffffffff6f8;
  undefined4 in_stack_fffffffffffff700;
  undefined4 in_stack_fffffffffffff704;
  undefined1 local_8c0 [64];
  string local_880 [32];
  string local_860 [32];
  pointer local_840;
  string local_838 [37];
  byte local_813;
  allocator local_812;
  byte local_811;
  string local_810 [32];
  string local_7f0 [32];
  char *local_7d0;
  string local_7c8 [32];
  string local_7a8 [32];
  string local_788 [32];
  _Base_ptr local_768;
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  undefined1 local_700 [64];
  string local_6c0 [32];
  undefined1 local_6a0 [64];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  char *local_600;
  byte local_5f3;
  allocator local_5f2;
  byte local_5f1;
  string local_5f0 [32];
  undefined1 local_5d0 [48];
  string local_5a0 [32];
  char *local_580;
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  undefined1 local_4f8 [64];
  string local_4b8 [32];
  string local_498 [38];
  byte local_472;
  undefined1 local_471 [33];
  string local_450 [39];
  bool local_429;
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  undefined1 local_388 [39];
  byte local_361;
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  pointer local_300;
  pointer local_2f8;
  string local_2f0 [32];
  undefined1 local_2d0 [64];
  string local_290 [32];
  _Base_ptr local_270;
  string local_268 [32];
  string local_248 [32];
  char *local_228;
  undefined1 local_220 [64];
  string local_1e0 [32];
  string local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [48];
  FieldDescriptor *local_20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_18;
  
  uVar15 = (undefined1)((ulong)in_stack_fffffffffffff6e0 >> 0x38);
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffff4d8 >> 0x20);
  local_20 = in_RCX;
  local_18._M_allocated_capacity = (size_type)in_RDX;
  local_18._8_8_ = in_RSI;
  bVar1 = FieldDescriptor::is_map(in_stack_fffffffffffff4e0);
  uVar13 = (uint)((ulong)in_stack_fffffffffffff4e0 >> 0x20);
  if (bVar1) {
    local_50._40_8_ = anon_unknown_0::MapFieldKey((FieldDescriptor *)0x46b70a);
    local_50._32_8_ = anon_unknown_0::MapFieldValue((FieldDescriptor *)0x46b71f);
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (in_stack_fffffffffffff5e8,(FieldDescriptor *)in_stack_fffffffffffff5e0,
               SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x30,0),
               SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x28,0),
               (BytesMode)in_stack_fffffffffffff600,
               SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x20,0));
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (in_stack_fffffffffffff5e8,(FieldDescriptor *)in_stack_fffffffffffff5e0,
               SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x30,0),
               SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x28,0),
               (BytesMode)in_stack_fffffffffffff600,
               SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x20,0));
    (anonymous_namespace)::FieldDefinition_abi_cxx11_
              ((GeneratorOptions *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8),
               in_stack_fffffffffffff6c0);
    pbVar11 = &local_70;
    io::Printer::
    Print<char[9],std::__cxx11::string,char[8],std::__cxx11::string,char[10],std::__cxx11::string>
              ((Printer *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560,
               (char (*) [9])in_stack_fffffffffffff558,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff550,(char (*) [8])in_stack_fffffffffffff548,
               &in_stack_fffffffffffff540->output_dir,(char (*) [10])in_stack_fffffffffffff580,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff588);
    std::__cxx11::string::~string(local_a0);
    FieldDescriptor::containing_type(local_20);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (in_stack_fffffffffffff558,(FieldDescriptor *)in_stack_fffffffffffff550,
               (BytesMode)((ulong)in_stack_fffffffffffff548 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff548 >> 0x18,0));
    std::operator+((char *)in_stack_fffffffffffff4e8,pbVar11);
    pbVar11 = &local_70;
    pcVar14 = "valuetype";
    pPVar12 = (Printer *)local_50;
    pcVar9 = "keytype";
    io::Printer::
    Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[10],std::__cxx11::string>
              (in_stack_fffffffffffff578,
               (char *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
               (char (*) [6])in_stack_fffffffffffff568,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff560,(char (*) [11])in_stack_fffffffffffff558,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff550,(char (*) [8])in_stack_fffffffffffff5a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff5af,in_stack_fffffffffffff5a8),
               (char (*) [10])in_stack_fffffffffffff5b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5b8);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_c0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar12,pcVar9,(FieldDescriptor *)0x46b97b);
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffff568);
    io::Printer::Print<char[6],std::__cxx11::string>
              ((Printer *)in_stack_fffffffffffff540,(char *)in_stack_fffffffffffff538,
               &in_stack_fffffffffffff530->variable_delimiter_,
               &in_stack_fffffffffffff528->output_dir);
    std::__cxx11::string::~string(local_120);
    TVar6 = FieldDescriptor::type((FieldDescriptor *)pbVar11);
    if (TVar6 == TYPE_MESSAGE) {
      FieldDescriptor::message_type((FieldDescriptor *)pPVar12);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
      io::Printer::Print<char[12],std::__cxx11::string>
                ((Printer *)in_stack_fffffffffffff540,(char *)in_stack_fffffffffffff538,
                 &in_stack_fffffffffffff530->variable_delimiter_,
                 &in_stack_fffffffffffff528->output_dir);
      std::__cxx11::string::~string(local_140);
    }
    else {
      io::Printer::Print<>(in_stack_fffffffffffff530,(char *)in_stack_fffffffffffff528);
    }
    io::Printer::Print<>(in_stack_fffffffffffff530,(char *)in_stack_fffffffffffff528);
    io::Printer::Print<>(in_stack_fffffffffffff530,(char *)in_stack_fffffffffffff528);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)0x46bc25);
    if (CVar4 == CPPTYPE_MESSAGE) {
      (anonymous_namespace)::FieldDefinition_abi_cxx11_
                ((GeneratorOptions *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8),
                 in_stack_fffffffffffff6c0);
      (anonymous_namespace)::FieldComments_abi_cxx11_
                (in_stack_fffffffffffff4f8,(BytesMode)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                (in_stack_fffffffffffff5e8,(FieldDescriptor *)in_stack_fffffffffffff5e0,
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x38,0),
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x30,0),
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x28,0),
                 (BytesMode)in_stack_fffffffffffff600,
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x20,0));
      pbVar11 = &local_1a0;
      io::Printer::
      Print<char[9],std::__cxx11::string,char[8],std::__cxx11::string,char[5],std::__cxx11::string>
                ((Printer *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560,
                 (char (*) [9])in_stack_fffffffffffff558,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff550,(char (*) [8])in_stack_fffffffffffff548,
                 &in_stack_fffffffffffff540->output_dir,(char (*) [5])in_stack_fffffffffffff580,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff588);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_160);
      FieldDescriptor::containing_type(local_20);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (in_stack_fffffffffffff558,(FieldDescriptor *)in_stack_fffffffffffff550,
                 (BytesMode)((ulong)in_stack_fffffffffffff548 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffff548 >> 0x18,0));
      std::operator+((char *)in_stack_fffffffffffff4e8,pbVar11);
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                (in_stack_fffffffffffff5e8,(FieldDescriptor *)in_stack_fffffffffffff5e0,
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x38,0),
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x30,0),
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x28,0),
                 (BytesMode)in_stack_fffffffffffff600,
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x20,0));
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46bded);
      local_228 = "";
      if (bVar1) {
        local_228 = "Repeated";
      }
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffff568);
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                (in_stack_fffffffffffff558,(FieldDescriptor *)in_stack_fffffffffffff550);
      LVar5 = FieldDescriptor::label(local_20);
      local_270 = (_Base_ptr)0x7605aa;
      if (LVar5 == LABEL_REQUIRED) {
        local_270 = (_Base_ptr)0x76a2b2;
      }
      in_stack_fffffffffffff520 = (Descriptor *)&local_270;
      pcVar14 = "rpt";
      pPVar12 = (Printer *)local_220;
      pcVar9 = "type";
      io::Printer::
      Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[5],std::__cxx11::string,char[4],char_const*,char[6],std::__cxx11::string,char[13],std::__cxx11::string,char[9],char_const*>
                (in_stack_fffffffffffff5c0,(char *)in_stack_fffffffffffff5b8,
                 (char (*) [6])in_stack_fffffffffffff5b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff5af,in_stack_fffffffffffff5a8),
                 (char (*) [11])in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                 (char (*) [5])in_stack_fffffffffffff600,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff608,(char (*) [4])in_stack_fffffffffffff610,
                 (char **)in_stack_fffffffffffff618,
                 (char (*) [6])
                 CONCAT17(in_stack_fffffffffffff627,
                          CONCAT43(in_stack_fffffffffffff623,
                                   CONCAT12(in_stack_fffffffffffff622,
                                            CONCAT11(in_stack_fffffffffffff621,
                                                     in_stack_fffffffffffff620)))),
                 in_stack_fffffffffffff628,&in_stack_fffffffffffff630->variable_delimiter_,
                 in_stack_fffffffffffff638,in_stack_fffffffffffff640,in_stack_fffffffffffff648);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string((string *)local_220);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string((string *)(local_220 + 0x20));
      std::__cxx11::string::~string(local_1c0);
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar12,pcVar9,(FieldDescriptor *)0x46bfa5);
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((ulong)pPVar12 & 0xffffffff00000000);
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                (in_stack_fffffffffffff5e8,(FieldDescriptor *)in_stack_fffffffffffff5e0,
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x38,0),
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x30,0),
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x28,0),
                 (BytesMode)in_stack_fffffffffffff600,
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x20,0));
      FieldDescriptor::containing_type(local_20);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (in_stack_fffffffffffff558,(FieldDescriptor *)in_stack_fffffffffffff550,
                 (BytesMode)((ulong)in_stack_fffffffffffff548 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffff548 >> 0x18,0));
      std::operator+(pcVar14,pbVar11);
      pOVar8 = FieldDescriptor::containing_oneof(local_20);
      local_2f8 = (pointer)0x7605aa;
      if (pOVar8 != (OneofDescriptor *)0x0) {
        local_2f8 = (pointer)0x76a393;
      }
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46c0bf);
      local_300 = (pointer)0x7605aa;
      if (bVar1) {
        local_300 = (pointer)0x7a9c5a;
      }
      pcVar14 = "oneoftag";
      pPVar12 = (Printer *)local_2d0;
      pcVar9 = "settername";
      io::Printer::
      Print<char[13],std::__cxx11::string,char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[9],char_const*,char[12],char_const*>
                ((Printer *)in_stack_fffffffffffff588,(char *)in_stack_fffffffffffff580,
                 &in_stack_fffffffffffff578->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                 (char (*) [6])in_stack_fffffffffffff568,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff560,&in_stack_fffffffffffff5c0->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                 (char (*) [9])in_stack_fffffffffffff5d0,(char **)in_stack_fffffffffffff5d8,
                 (char (*) [12])in_stack_fffffffffffff5e0,(char **)in_stack_fffffffffffff5e8);
      std::__cxx11::string::~string((string *)local_2d0);
      std::__cxx11::string::~string(local_2f0);
      std::__cxx11::string::~string((string *)(local_2d0 + 0x20));
      std::__cxx11::string::~string(local_290);
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar12,pcVar9,(FieldDescriptor *)0x46c1b7);
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffff568);
      local_361 = 0;
      local_388[0x25] = 0;
      pOVar8 = FieldDescriptor::containing_oneof(local_20);
      if (pOVar8 == (OneofDescriptor *)0x0) {
        std::allocator<char>::allocator();
        local_388[0x25] = 1;
        std::__cxx11::string::string(local_340,"",(allocator *)(local_388 + 0x26));
      }
      else {
        (anonymous_namespace)::JSOneofArray_abi_cxx11_
                  ((GeneratorOptions *)in_stack_fffffffffffff588,
                   (FieldDescriptor *)in_stack_fffffffffffff580);
        local_361 = 1;
        std::operator+(pcVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar12);
      }
      io::Printer::Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string>
                (in_stack_fffffffffffff550,(char *)in_stack_fffffffffffff548,
                 (char (*) [6])in_stack_fffffffffffff540,in_stack_fffffffffffff538,
                 &in_stack_fffffffffffff530->variable_delimiter_,
                 &in_stack_fffffffffffff528->output_dir);
      std::__cxx11::string::~string(local_340);
      if ((local_388[0x25] & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(local_388 + 0x26));
      }
      if ((local_361 & 1) != 0) {
        std::__cxx11::string::~string(local_360);
      }
      std::__cxx11::string::~string(local_320);
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46c322);
      if (bVar1) {
        GenerateRepeatedMessageHelperMethods
                  (in_stack_fffffffffffff670,in_stack_fffffffffffff668,in_stack_fffffffffffff660,
                   in_stack_fffffffffffff658);
      }
    }
    else {
      local_388[0x24] = 0;
      TVar6 = FieldDescriptor::type(in_stack_fffffffffffff4f0);
      bytes_mode_00 = (BytesMode)((ulong)in_stack_fffffffffffff648 >> 0x20);
      local_981 = 0;
      if (TVar6 == TYPE_BYTES) {
        local_981 = *(bool *)(local_18._8_8_ + 0x40) ^ 0xff;
      }
      local_388._32_4_ = ZEXT14((local_981 & 1) != 0);
      pcVar9 = (char *)CONCAT44(uVar10,local_388._32_4_);
      pPVar12 = (Printer *)((ulong)uVar13 << 0x20);
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                (in_stack_fffffffffffff5e8,(FieldDescriptor *)in_stack_fffffffffffff5e0,
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x38,0),
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x30,0),
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x28,0),
                 (BytesMode)in_stack_fffffffffffff600,
                 SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x20,0));
      if ((local_388[0x24] & 1) == 0) {
        (anonymous_namespace)::FieldDefinition_abi_cxx11_
                  ((GeneratorOptions *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8)
                   ,in_stack_fffffffffffff6c0);
        (anonymous_namespace)::FieldComments_abi_cxx11_
                  (in_stack_fffffffffffff4f8,(BytesMode)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
        pPVar12 = (Printer *)local_388;
        pcVar9 = "type";
        io::Printer::
        Print<char[9],std::__cxx11::string,char[8],std::__cxx11::string,char[5],std::__cxx11::string>
                  ((Printer *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560,
                   (char (*) [9])in_stack_fffffffffffff558,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff550,(char (*) [8])in_stack_fffffffffffff548,
                   &in_stack_fffffffffffff540->output_dir,(char (*) [5])in_stack_fffffffffffff580,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff588);
        std::__cxx11::string::~string(local_3c8);
        std::__cxx11::string::~string(local_3a8);
      }
      else {
        io::Printer::Print<>(in_stack_fffffffffffff530,(char *)in_stack_fffffffffffff528);
      }
      uVar16 = local_18._M_allocated_capacity;
      uVar17 = local_18._8_8_;
      FieldDescriptor::containing_type(local_20);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (in_stack_fffffffffffff558,(FieldDescriptor *)in_stack_fffffffffffff550,
                 (BytesMode)((ulong)in_stack_fffffffffffff548 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffff548 >> 0x18,0));
      std::operator+((char *)in_stack_fffffffffffff4e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar12);
      io::Printer::Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string>
                (in_stack_fffffffffffff550,(char *)in_stack_fffffffffffff548,
                 (char (*) [6])in_stack_fffffffffffff540,in_stack_fffffffffffff538,
                 &in_stack_fffffffffffff530->variable_delimiter_,
                 &in_stack_fffffffffffff528->output_dir);
      std::__cxx11::string::~string(local_408);
      std::__cxx11::string::~string(local_428);
      std::__cxx11::string::~string(local_3e8);
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar12,pcVar9,(FieldDescriptor *)0x46c8b7);
      if ((local_388[0x24] & 1) == 0) {
        io::Printer::Print<char[5],std::__cxx11::string>
                  ((Printer *)in_stack_fffffffffffff540,(char *)in_stack_fffffffffffff538,
                   &in_stack_fffffffffffff530->variable_delimiter_,
                   &in_stack_fffffffffffff528->output_dir);
      }
      else {
        io::Printer::Print<>(in_stack_fffffffffffff530,(char *)in_stack_fffffffffffff528);
      }
      uVar2 = anon_unknown_0::ReturnsNullWhenUnset
                        (in_stack_fffffffffffff4e8,(FieldDescriptor *)pPVar12);
      local_429 = (bool)((uVar2 ^ 0xff) & 1);
      if (((local_388[0x24] & 1) != 0) &&
         (in_stack_fffffffffffff656 = FieldDescriptor::has_default_value(local_20),
         !(bool)in_stack_fffffffffffff656)) {
        local_429 = false;
      }
      uVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46c9e7);
      if ((bool)uVar3) {
        local_429 = false;
      }
      GenerateFieldValueExpression
                ((Generator *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                 in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                 (bool)uVar15);
      if ((local_388[0x24] & 1) == 0) {
        io::Printer::Print<>(in_stack_fffffffffffff530,(char *)in_stack_fffffffffffff528);
      }
      else {
        io::Printer::Print<>(in_stack_fffffffffffff530,(char *)in_stack_fffffffffffff528);
      }
      TVar6 = FieldDescriptor::type(in_stack_fffffffffffff4f0);
      if ((TVar6 == TYPE_BYTES) && ((local_388[0x24] & 1) == 0)) {
        GenerateBytesWrapper
                  ((GeneratorOptions *)uVar17,(Printer *)uVar16,
                   (FieldDescriptor *)
                   CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff656,
                                           CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff654,0xc))))
                   ,bytes_mode_00);
        GenerateBytesWrapper
                  ((GeneratorOptions *)uVar17,(Printer *)uVar16,
                   (FieldDescriptor *)
                   CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff656,
                                           CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff654,TVar6))
                                          )),bytes_mode_00);
      }
      uVar16 = local_18._M_allocated_capacity;
      uVar17 = local_18._8_8_;
      FieldDescriptor::containing_type(local_20);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
      local_472 = 0;
      if ((local_388[0x24] & 1) == 0) {
        pPVar12 = (Printer *)((ulong)pPVar12 & 0xffffffff00000000);
        (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                  (in_stack_fffffffffffff5e8,(FieldDescriptor *)in_stack_fffffffffffff5e0,
                   SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x38,0),
                   SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x30,0),
                   SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x28,0),
                   (BytesMode)in_stack_fffffffffffff600,
                   SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x20,0));
      }
      else {
        in_stack_fffffffffffff630 = (Printer *)local_471;
        std::allocator<char>::allocator();
        local_472 = 1;
        std::__cxx11::string::string
                  ((string *)(local_471 + 1),"*",(allocator *)in_stack_fffffffffffff630);
      }
      io::Printer::Print<char[6],std::__cxx11::string,char[13],std::__cxx11::string>
                (in_stack_fffffffffffff550,(char *)in_stack_fffffffffffff548,
                 (char (*) [6])in_stack_fffffffffffff540,in_stack_fffffffffffff538,
                 &in_stack_fffffffffffff530->variable_delimiter_,
                 &in_stack_fffffffffffff528->output_dir);
      std::__cxx11::string::~string((string *)(local_471 + 1));
      if ((local_472 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)local_471);
      }
      std::__cxx11::string::~string(local_450);
      this_00 = FieldDescriptor::file(local_20);
      SVar7 = FileDescriptor::syntax(this_00);
      uVar15 = (undefined1)(SVar7 >> 0x18);
      if ((((SVar7 != SYNTAX_PROTO3) ||
           (bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46cc7b), bVar1)) ||
          (bVar1 = FieldDescriptor::is_map((FieldDescriptor *)pPVar12), bVar1)) ||
         (bVar1 = anon_unknown_0::HasFieldPresence
                            (in_stack_fffffffffffff4e8,(FieldDescriptor *)pPVar12), bVar1)) {
        in_stack_fffffffffffff5f0 = local_18._M_allocated_capacity;
        in_stack_fffffffffffff5f8 = local_18._8_8_;
        in_stack_fffffffffffff600 = FieldDescriptor::containing_type(local_20);
        (anonymous_namespace)::GetMessagePath_abi_cxx11_
                  (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
        (anonymous_namespace)::JSGetterName_abi_cxx11_
                  (in_stack_fffffffffffff558,(FieldDescriptor *)in_stack_fffffffffffff550,
                   (BytesMode)((ulong)in_stack_fffffffffffff548 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffff548 >> 0x18,0));
        std::operator+((char *)in_stack_fffffffffffff4e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar12)
        ;
        in_stack_fffffffffffff5e8 = (GeneratorOptions *)FieldDescriptor::containing_oneof(local_20);
        local_580 = "";
        if (in_stack_fffffffffffff5e8 != (GeneratorOptions *)0x0) {
          local_580 = "Oneof";
        }
        (anonymous_namespace)::JSFieldIndex_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffff568)
        ;
        pcVar14 = "index";
        pPVar12 = (Printer *)&local_580;
        pcVar9 = "oneoftag";
        io::Printer::
        Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[9],char_const*,char[6],std::__cxx11::string>
                  (in_stack_fffffffffffff578,
                   (char *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                   (char (*) [6])in_stack_fffffffffffff568,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff560,(char (*) [11])in_stack_fffffffffffff558,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff550,(char (*) [9])in_stack_fffffffffffff5a0,
                   (char **)CONCAT17(in_stack_fffffffffffff5af,in_stack_fffffffffffff5a8),
                   (char (*) [6])in_stack_fffffffffffff5b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff5b8);
        std::__cxx11::string::~string((string *)(local_5d0 + 0x30));
        std::__cxx11::string::~string(local_558);
        std::__cxx11::string::~string(local_578);
        std::__cxx11::string::~string(local_538);
        io::Printer::Annotate<google::protobuf::FieldDescriptor>
                  (pPVar12,pcVar9,(FieldDescriptor *)0x46d131);
        local_5d0._32_8_ = "";
        local_5d0._40_8_ = "";
        if ((local_388[0x24] & 1) != 0) {
          local_5d0._40_8_ = "/** @type{string|number|boolean|Array|undefined} */(";
        }
        if ((local_388[0x24] & 1) != 0) {
          local_5d0._32_8_ = ")";
        }
        local_5f1 = 0;
        local_5f3 = 0;
        in_stack_fffffffffffff5d8 = local_18._M_allocated_capacity;
        in_stack_fffffffffffff5e0 = FieldDescriptor::containing_oneof(local_20);
        if (in_stack_fffffffffffff5e0 == (OneofDescriptor *)0x0) {
          in_stack_fffffffffffff5d0 = &local_5f2;
          std::allocator<char>::allocator();
          local_5f3 = 1;
          std::__cxx11::string::string((string *)local_5d0,"",in_stack_fffffffffffff5d0);
        }
        else {
          (anonymous_namespace)::JSOneofArray_abi_cxx11_
                    ((GeneratorOptions *)in_stack_fffffffffffff588,
                     (FieldDescriptor *)in_stack_fffffffffffff580);
          local_5f1 = 1;
          std::operator+(pcVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pPVar12);
        }
        in_stack_fffffffffffff5cf = FieldDescriptor::is_repeated((FieldDescriptor *)0x46d24d);
        local_600 = "";
        if ((bool)in_stack_fffffffffffff5cf) {
          local_600 = " || []";
        }
        pcVar14 = "rptvalueinit";
        pPVar12 = (Printer *)local_5d0;
        io::Printer::
        Print<char[5],char_const*,char[10],char_const*,char[11],std::__cxx11::string,char[13],char_const*>
                  ((Printer *)in_stack_fffffffffffff5b8,(char *)in_stack_fffffffffffff5b0,
                   (char (*) [5])CONCAT17(in_stack_fffffffffffff5af,in_stack_fffffffffffff5a8),
                   (char **)in_stack_fffffffffffff5a0,(char (*) [10])in_stack_fffffffffffff598,
                   in_stack_fffffffffffff590,(char (*) [11])in_stack_fffffffffffff5d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff5d8,(char (*) [13])in_stack_fffffffffffff5e0,
                   (char **)in_stack_fffffffffffff5e8);
        std::__cxx11::string::~string((string *)local_5d0);
        if ((local_5f3 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_5f2);
        }
        if ((local_5f1 & 1) != 0) {
          std::__cxx11::string::~string(local_5f0);
        }
      }
      else {
        in_stack_fffffffffffff608 = local_18._M_allocated_capacity;
        in_stack_fffffffffffff610 = local_18._8_8_;
        in_stack_fffffffffffff618 = FieldDescriptor::containing_type(local_20);
        (anonymous_namespace)::GetMessagePath_abi_cxx11_
                  (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
        (anonymous_namespace)::JSGetterName_abi_cxx11_
                  (in_stack_fffffffffffff558,(FieldDescriptor *)in_stack_fffffffffffff550,
                   (BytesMode)((ulong)in_stack_fffffffffffff548 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffff548 >> 0x18,0));
        std::operator+((char *)in_stack_fffffffffffff4e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar12)
        ;
        (anonymous_namespace)::JSTypeTag_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffff548);
        (anonymous_namespace)::JSFieldIndex_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffff568)
        ;
        pcVar14 = "index";
        pPVar12 = (Printer *)local_4f8;
        pcVar9 = "typetag";
        io::Printer::
        Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[6],std::__cxx11::string>
                  (in_stack_fffffffffffff578,
                   (char *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                   (char (*) [6])in_stack_fffffffffffff568,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff560,(char (*) [11])in_stack_fffffffffffff558,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff550,(char (*) [8])in_stack_fffffffffffff5a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff5af,in_stack_fffffffffffff5a8),
                   (char (*) [6])in_stack_fffffffffffff5b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff5b8);
        std::__cxx11::string::~string(local_518);
        std::__cxx11::string::~string((string *)local_4f8);
        std::__cxx11::string::~string(local_4b8);
        std::__cxx11::string::~string((string *)(local_4f8 + 0x20));
        std::__cxx11::string::~string(local_498);
        io::Printer::Annotate<google::protobuf::FieldDescriptor>
                  (pPVar12,pcVar9,(FieldDescriptor *)0x46ce73);
      }
      if ((local_388[0x24] & 1) != 0) {
        in_stack_fffffffffffff5b0 = local_18._M_allocated_capacity;
        in_stack_fffffffffffff5b8 = local_18._8_8_;
        in_stack_fffffffffffff5c0 = (Printer *)FieldDescriptor::containing_type(local_20);
        (anonymous_namespace)::GetMessagePath_abi_cxx11_
                  (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
        io::Printer::Print<char[6],std::__cxx11::string>
                  ((Printer *)in_stack_fffffffffffff540,(char *)in_stack_fffffffffffff538,
                   &in_stack_fffffffffffff530->variable_delimiter_,
                   &in_stack_fffffffffffff528->output_dir);
        std::__cxx11::string::~string(local_620);
      }
      in_stack_fffffffffffff5af = FieldDescriptor::is_repeated((FieldDescriptor *)0x46d4ff);
      if ((bool)in_stack_fffffffffffff5af) {
        GenerateRepeatedPrimitiveHelperMethods
                  ((Generator *)uVar17,(GeneratorOptions *)uVar16,in_stack_fffffffffffff630,
                   (FieldDescriptor *)this_00,(bool)uVar15);
      }
      std::__cxx11::string::~string((string *)local_388);
    }
  }
  bVar1 = FieldDescriptor::is_map((FieldDescriptor *)pPVar12);
  if (bVar1) {
    FieldDescriptor::containing_type(local_20);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (in_stack_fffffffffffff558,(FieldDescriptor *)in_stack_fffffffffffff550,
               (BytesMode)((ulong)in_stack_fffffffffffff548 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff548 >> 0x18,0));
    std::operator+(pcVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar12);
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (in_stack_fffffffffffff558,(FieldDescriptor *)in_stack_fffffffffffff550,
               (BytesMode)((ulong)in_stack_fffffffffffff548 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff548 >> 0x18,0));
    std::operator+(pcVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar12);
    pPVar12 = (Printer *)local_6a0;
    pcVar9 = "gettername";
    io::Printer::
    Print<char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[11],std::__cxx11::string>
              ((Printer *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560,
               (char (*) [6])in_stack_fffffffffffff558,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff550,(char (*) [12])in_stack_fffffffffffff548,
               &in_stack_fffffffffffff540->output_dir,(char (*) [11])in_stack_fffffffffffff580,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff588);
    std::__cxx11::string::~string((string *)local_6a0);
    std::__cxx11::string::~string(local_6c0);
    std::__cxx11::string::~string(local_660);
    std::__cxx11::string::~string((string *)(local_6a0 + 0x20));
    std::__cxx11::string::~string(local_640);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar12,pcVar9,(FieldDescriptor *)0x46d6f9);
  }
  else {
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46d7c0);
    if ((bVar1) ||
       ((CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)0x46d7d1), CVar4 == CPPTYPE_MESSAGE &&
        (bVar1 = FieldDescriptor::is_required((FieldDescriptor *)0x46d7e7), !bVar1)))) {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46d80c);
      if (bVar1) {
        in_stack_fffffffffffff588 = "Clears the list making it empty but non-null.";
      }
      else {
        in_stack_fffffffffffff588 = "Clears the message field making it undefined.";
      }
      FieldDescriptor::containing_type(local_20);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (in_stack_fffffffffffff558,(FieldDescriptor *)in_stack_fffffffffffff550,
                 (BytesMode)((ulong)in_stack_fffffffffffff548 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffff548 >> 0x18,0));
      std::operator+(pcVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar12);
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (in_stack_fffffffffffff558,(FieldDescriptor *)in_stack_fffffffffffff550,
                 (BytesMode)((ulong)in_stack_fffffffffffff548 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffff548 >> 0x18,0));
      std::operator+(pcVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar12);
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46d90c);
      local_768 = (_Base_ptr)0x76c4e2;
      if (bVar1) {
        local_768 = (_Base_ptr)0x769ad1;
      }
      pcVar14 = "settername";
      pPVar12 = (Printer *)local_700;
      pcVar9 = "clearername";
      io::Printer::
      Print<char[6],char[46],char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[11],std::__cxx11::string,char[13],char_const*>
                ((Printer *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                 &in_stack_fffffffffffff5c0->variable_delimiter_,
                 (char (*) [6])in_stack_fffffffffffff5b8,(char (*) [46])in_stack_fffffffffffff5b0,
                 (char (*) [6])CONCAT17(in_stack_fffffffffffff5af,in_stack_fffffffffffff5a8),
                 in_stack_fffffffffffff5a0,(char (*) [12])in_stack_fffffffffffff5f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5f8,(char (*) [11])in_stack_fffffffffffff600,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff608,(char (*) [13])in_stack_fffffffffffff610,
                 (char **)in_stack_fffffffffffff618);
      std::__cxx11::string::~string(local_740);
      std::__cxx11::string::~string(local_760);
      std::__cxx11::string::~string((string *)local_700);
      std::__cxx11::string::~string(local_720);
      std::__cxx11::string::~string((string *)(local_700 + 0x20));
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar12,pcVar9,(FieldDescriptor *)0x46da13);
      in_stack_fffffffffffff580 = (GeneratorOptions *)local_18._8_8_;
    }
    else {
      bVar1 = anon_unknown_0::HasFieldPresence
                        ((GeneratorOptions *)pcVar14,(FieldDescriptor *)pPVar12);
      if (bVar1) {
        in_stack_fffffffffffff560 = local_18._M_allocated_capacity;
        FieldDescriptor::containing_type(local_20);
        (anonymous_namespace)::GetMessagePath_abi_cxx11_
                  (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
        (anonymous_namespace)::JSGetterName_abi_cxx11_
                  (in_stack_fffffffffffff558,(FieldDescriptor *)in_stack_fffffffffffff550,
                   (BytesMode)((ulong)in_stack_fffffffffffff548 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffff548 >> 0x18,0));
        std::operator+(pcVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar12);
        in_stack_fffffffffffff558 = (GeneratorOptions *)FieldDescriptor::containing_oneof(local_20);
        local_7d0 = "";
        if (in_stack_fffffffffffff558 != (GeneratorOptions *)0x0) {
          local_7d0 = "Oneof";
        }
        local_811 = 0;
        local_813 = 0;
        in_stack_fffffffffffff550 = (Printer *)FieldDescriptor::containing_oneof(local_20);
        if (in_stack_fffffffffffff550 == (Printer *)0x0) {
          in_stack_fffffffffffff548 = &local_812;
          std::allocator<char>::allocator();
          local_813 = 1;
          std::__cxx11::string::string(local_7f0,"",in_stack_fffffffffffff548);
          in_stack_fffffffffffff568 = (GeneratorOptions *)local_18._8_8_;
        }
        else {
          (anonymous_namespace)::JSOneofArray_abi_cxx11_
                    ((GeneratorOptions *)in_stack_fffffffffffff588,
                     (FieldDescriptor *)in_stack_fffffffffffff580);
          local_811 = 1;
          std::operator+(pcVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pPVar12);
          in_stack_fffffffffffff568 = (GeneratorOptions *)local_18._8_8_;
        }
        (anonymous_namespace)::JSFieldIndex_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffff568)
        ;
        pcVar14 = "maybeoneofgroup";
        pPVar12 = (Printer *)&local_7d0;
        pcVar9 = "maybeoneof";
        io::Printer::
        Print<char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[11],char_const*,char[16],std::__cxx11::string,char[6],std::__cxx11::string>
                  ((Printer *)in_stack_fffffffffffff588,(char *)in_stack_fffffffffffff580,
                   &in_stack_fffffffffffff578->variable_delimiter_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                   (char (*) [12])in_stack_fffffffffffff568,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff560,&in_stack_fffffffffffff5c0->variable_delimiter_,
                   (char **)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                   (char (*) [16])in_stack_fffffffffffff5d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff5d8,(char (*) [6])in_stack_fffffffffffff5e0,
                   &in_stack_fffffffffffff5e8->output_dir);
        std::__cxx11::string::~string(local_838);
        std::__cxx11::string::~string(local_7f0);
        if ((local_813 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_812);
        }
        if ((local_811 & 1) != 0) {
          std::__cxx11::string::~string(local_810);
        }
        std::__cxx11::string::~string(local_7a8);
        std::__cxx11::string::~string(local_7c8);
        std::__cxx11::string::~string(local_788);
        io::Printer::Annotate<google::protobuf::FieldDescriptor>
                  (pPVar12,pcVar9,(FieldDescriptor *)0x46dd7d);
        bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46dd97);
        local_840 = (pointer)0x76c4e2;
        if (bVar1) {
          local_840 = (pointer)0x769ad1;
        }
        io::Printer::Print<char[13],char_const*>
                  ((Printer *)in_stack_fffffffffffff580,
                   &in_stack_fffffffffffff578->variable_delimiter_,
                   (char (*) [13])CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                   (char **)in_stack_fffffffffffff568);
        in_stack_fffffffffffff540 = (GeneratorOptions *)local_18._M_allocated_capacity;
      }
    }
  }
  bVar1 = anon_unknown_0::HasFieldPresence((GeneratorOptions *)pcVar14,(FieldDescriptor *)pPVar12);
  if (bVar1) {
    FieldDescriptor::containing_type(local_20);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (in_stack_fffffffffffff558,(FieldDescriptor *)in_stack_fffffffffffff550,
               (BytesMode)((ulong)in_stack_fffffffffffff548 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff548 >> 0x18,0));
    std::operator+(pcVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar12);
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffff568);
    pPVar12 = (Printer *)local_8c0;
    pcVar9 = "index";
    io::Printer::
    Print<char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[6],std::__cxx11::string>
              ((Printer *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560,
               (char (*) [6])in_stack_fffffffffffff558,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff550,(char (*) [10])in_stack_fffffffffffff548,
               &in_stack_fffffffffffff540->output_dir,(char (*) [6])in_stack_fffffffffffff580,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff588);
    std::__cxx11::string::~string((string *)local_8c0);
    std::__cxx11::string::~string(local_880);
    std::__cxx11::string::~string((string *)(local_8c0 + 0x20));
    std::__cxx11::string::~string(local_860);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar12,pcVar9,(FieldDescriptor *)0x46e04a);
  }
  return;
}

Assistant:

void Generator::GenerateClassField(const GeneratorOptions& options,
                                   io::Printer* printer,
                                   const FieldDescriptor* field) const {
  if (field->is_map()) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    // Map field: special handling to instantiate the map object on demand.
    std::string key_type =
        JSFieldTypeAnnotation(options, key_field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ true,
                              /* singular_if_not_packed = */ false);
    std::string value_type =
        JSFieldTypeAnnotation(options, value_field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ true,
                              /* singular_if_not_packed = */ false);

    printer->Print(
        "/**\n"
        " * $fielddef$\n"
        " * @param {boolean=} opt_noLazyCreate Do not create the map if\n"
        " * empty, instead returning `undefined`\n"
        " * @return {!jspb.Map<$keytype$,$valuetype$>}\n"
        " */\n",
        "fielddef", FieldDefinition(options, field), "keytype", key_type,
        "valuetype", value_type);
    printer->Print(
        "$class$.prototype.$gettername$ = function(opt_noLazyCreate) {\n"
        "  return /** @type {!jspb.Map<$keytype$,$valuetype$>} */ (\n",
        "class", GetMessagePath(options, field->containing_type()),
        "gettername", "get" + JSGetterName(options, field), "keytype", key_type,
        "valuetype", value_type);
    printer->Annotate("gettername", field);
    printer->Print(
        "      jspb.Message.getMapField(this, $index$, opt_noLazyCreate",
        "index", JSFieldIndex(field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(
          ",\n"
          "      $messageType$",
          "messageType", GetMessagePath(options, value_field->message_type()));
    } else {
      printer->Print(
          ",\n"
          "      null");
    }

    printer->Print("));\n");

    printer->Print(
        "};\n"
        "\n"
        "\n");
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    // Message field: special handling in order to wrap the underlying data
    // array with a message object.

    printer->Print(
        "/**\n"
        " * $fielddef$\n"
        "$comment$"
        " * @return {$type$}\n"
        " */\n",
        "fielddef", FieldDefinition(options, field), "comment",
        FieldComments(field, BYTES_DEFAULT), "type",
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false));
    printer->Print(
        "$class$.prototype.$gettername$ = function() {\n"
        "  return /** @type{$type$} */ (\n"
        "    jspb.Message.get$rpt$WrapperField(this, $wrapperclass$, "
        "$index$$required$));\n"
        "};\n"
        "\n"
        "\n",
        "class", GetMessagePath(options, field->containing_type()),
        "gettername", "get" + JSGetterName(options, field), "type",
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false),
        "rpt", (field->is_repeated() ? "Repeated" : ""), "index",
        JSFieldIndex(field), "wrapperclass", SubmessageTypeRef(options, field),
        "required",
        (field->label() == FieldDescriptor::LABEL_REQUIRED ? ", 1" : ""));
    printer->Annotate("gettername", field);
    printer->Print(
        "/**\n"
        " * @param {$optionaltype$} value\n"
        " * @return {!$class$} returns this\n"
        "*/\n"
        "$class$.prototype.$settername$ = function(value) {\n"
        "  return jspb.Message.set$oneoftag$$repeatedtag$WrapperField(",
        "optionaltype",
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ true,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false),
        "class", GetMessagePath(options, field->containing_type()),
        "settername", "set" + JSGetterName(options, field), "oneoftag",
        (field->containing_oneof() ? "Oneof" : ""), "repeatedtag",
        (field->is_repeated() ? "Repeated" : ""));
    printer->Annotate("settername", field);

    printer->Print(
        "this, $index$$oneofgroup$, value);\n"
        "};\n"
        "\n"
        "\n",
        "index", JSFieldIndex(field), "oneofgroup",
        (field->containing_oneof() ? (", " + JSOneofArray(options, field))
                                   : ""));

    if (field->is_repeated()) {
      GenerateRepeatedMessageHelperMethods(options, printer, field);
    }

  } else {
    bool untyped =
        false;

    // Simple (primitive) field, either singular or repeated.

    // TODO(b/26173701): Always use BYTES_DEFAULT for the getter return type;
    // at this point we "lie" to non-binary users and tell the return
    // type is always base64 string, pending a LSC to migrate to typed getters.
    BytesMode bytes_mode =
        field->type() == FieldDescriptor::TYPE_BYTES && !options.binary
            ? BYTES_B64
            : BYTES_DEFAULT;
    std::string typed_annotation =
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false,
                              /* bytes_mode = */ bytes_mode);
    if (untyped) {
      printer->Print(
          "/**\n"
          " * @return {?} Raw field, untyped.\n"
          " */\n");
    } else {
      printer->Print(
          "/**\n"
          " * $fielddef$\n"
          "$comment$"
          " * @return {$type$}\n"
          " */\n",
          "fielddef", FieldDefinition(options, field), "comment",
          FieldComments(field, bytes_mode), "type", typed_annotation);
    }

    printer->Print("$class$.prototype.$gettername$ = function() {\n", "class",
                   GetMessagePath(options, field->containing_type()),
                   "gettername", "get" + JSGetterName(options, field));
    printer->Annotate("gettername", field);

    if (untyped) {
      printer->Print("  return ");
    } else {
      printer->Print("  return /** @type {$type$} */ (", "type",
                     typed_annotation);
    }

    bool use_default = !ReturnsNullWhenUnset(options, field);

    // Raw fields with no default set should just return undefined.
    if (untyped && !field->has_default_value()) {
      use_default = false;
    }

    // Repeated fields get initialized to their default in the constructor
    // (why?), so we emit a plain getField() call for them.
    if (field->is_repeated()) {
      use_default = false;
    }

    GenerateFieldValueExpression(printer, "this", field, use_default);

    if (untyped) {
      printer->Print(
          ";\n"
          "};\n"
          "\n"
          "\n");
    } else {
      printer->Print(
          ");\n"
          "};\n"
          "\n"
          "\n");
    }

    if (field->type() == FieldDescriptor::TYPE_BYTES && !untyped) {
      GenerateBytesWrapper(options, printer, field, BYTES_B64);
      GenerateBytesWrapper(options, printer, field, BYTES_U8);
    }

    printer->Print(
        "/**\n"
        " * @param {$optionaltype$} value\n"
        " * @return {!$class$} returns this\n"
        " */\n",
        "class", GetMessagePath(options, field->containing_type()),
        "optionaltype",
        untyped ? "*"
                : JSFieldTypeAnnotation(options, field,
                                        /* is_setter_argument = */ true,
                                        /* force_present = */ false,
                                        /* singular_if_not_packed = */ false));

    if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3 &&
        !field->is_repeated() && !field->is_map() &&
        !HasFieldPresence(options, field)) {
      // Proto3 non-repeated and non-map fields without presence use the
      // setProto3*Field function.
      printer->Print(
          "$class$.prototype.$settername$ = function(value) {\n"
          "  return jspb.Message.setProto3$typetag$Field(this, $index$, "
          "value);"
          "\n"
          "};\n"
          "\n"
          "\n",
          "class", GetMessagePath(options, field->containing_type()),
          "settername", "set" + JSGetterName(options, field), "typetag",
          JSTypeTag(field), "index", JSFieldIndex(field));
      printer->Annotate("settername", field);
    } else {
      // Otherwise, use the regular setField function.
      printer->Print(
          "$class$.prototype.$settername$ = function(value) {\n"
          "  return jspb.Message.set$oneoftag$Field(this, $index$",
          "class", GetMessagePath(options, field->containing_type()),
          "settername", "set" + JSGetterName(options, field), "oneoftag",
          (field->containing_oneof() ? "Oneof" : ""), "index",
          JSFieldIndex(field));
      printer->Annotate("settername", field);
      printer->Print(
          "$oneofgroup$, $type$value$rptvalueinit$$typeclose$);\n"
          "};\n"
          "\n"
          "\n",
          "type",
          untyped ? "/** @type{string|number|boolean|Array|undefined} */(" : "",
          "typeclose", untyped ? ")" : "", "oneofgroup",
          (field->containing_oneof() ? (", " + JSOneofArray(options, field))
                                     : ""),
          "rptvalueinit", (field->is_repeated() ? " || []" : ""));
    }

    if (untyped) {
      printer->Print(
          "/**\n"
          " * Clears the value.\n"
          " * @return {!$class$} returns this\n"
          " */\n",
          "class", GetMessagePath(options, field->containing_type()));
    }

    if (field->is_repeated()) {
      GenerateRepeatedPrimitiveHelperMethods(options, printer, field, untyped);
    }
  }

  // Generate clearFoo() method for map fields, repeated fields, and other
  // fields with presence.
  if (field->is_map()) {
    // clang-format off
    printer->Print(
        "/**\n"
        " * Clears values from the map. The map will be non-null.\n"
        " * @return {!$class$} returns this\n"
        " */\n"
        "$class$.prototype.$clearername$ = function() {\n"
        "  this.$gettername$().clear();\n"
        "  return this;"
        "};\n"
        "\n"
        "\n",
        "class", GetMessagePath(options, field->containing_type()),
        "clearername", "clear" + JSGetterName(options, field),
        "gettername", "get" + JSGetterName(options, field));
    // clang-format on
    printer->Annotate("clearername", field);
  } else if (field->is_repeated() ||
             (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
              !field->is_required())) {
    // Fields where we can delegate to the regular setter.
    // clang-format off
    printer->Print(
        "/**\n"
        " * $jsdoc$\n"
        " * @return {!$class$} returns this\n"
        " */\n"
        "$class$.prototype.$clearername$ = function() {\n"
        "  return this.$settername$($clearedvalue$);\n"
        "};\n"
        "\n"
        "\n",
       "jsdoc", field->is_repeated()
           ? "Clears the list making it empty but non-null."
           : "Clears the message field making it undefined.",
        "class", GetMessagePath(options, field->containing_type()),
        "clearername", "clear" + JSGetterName(options, field),
        "settername", "set" + JSGetterName(options, field),
        "clearedvalue", (field->is_repeated() ? "[]" : "undefined"));
    // clang-format on
    printer->Annotate("clearername", field);
  } else if (HasFieldPresence(options, field)) {
    // Fields where we can't delegate to the regular setter because it doesn't
    // accept "undefined" as an argument.
    // clang-format off
    printer->Print(
        "/**\n"
        " * Clears the field making it undefined.\n"
        " * @return {!$class$} returns this\n"
        " */\n"
        "$class$.prototype.$clearername$ = function() {\n"
        "  return jspb.Message.set$maybeoneof$Field(this, "
            "$index$$maybeoneofgroup$, ",
        "class", GetMessagePath(options, field->containing_type()),
        "clearername", "clear" + JSGetterName(options, field),
        "maybeoneof", (field->containing_oneof() ? "Oneof" : ""),
        "maybeoneofgroup", (field->containing_oneof()
                            ? (", " + JSOneofArray(options, field))
                            : ""),
        "index", JSFieldIndex(field));
    // clang-format on
    printer->Annotate("clearername", field);
    printer->Print(
        "$clearedvalue$);\n"
        "};\n"
        "\n"
        "\n",
        "clearedvalue", (field->is_repeated() ? "[]" : "undefined"));
  }

  if (HasFieldPresence(options, field)) {
    printer->Print(
        "/**\n"
        " * Returns whether this field is set.\n"
        " * @return {boolean}\n"
        " */\n"
        "$class$.prototype.$hasername$ = function() {\n"
        "  return jspb.Message.getField(this, $index$) != null;\n"
        "};\n"
        "\n"
        "\n",
        "class", GetMessagePath(options, field->containing_type()), "hasername",
        "has" + JSGetterName(options, field), "index", JSFieldIndex(field));
    printer->Annotate("hasername", field);
  }
}